

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::LogFinish(void)

{
  _func_void_void_ptr_char_ptr *p_Var1;
  char *pcVar2;
  ImGuiContext *pIVar3;
  char *pcVar4;
  
  pIVar3 = GImGui;
  if (GImGui->LogEnabled == true) {
    LogText("\n");
    switch(pIVar3->LogType) {
    case ImGuiLogType_None:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0x24a7,"void ImGui::LogFinish()");
    case ImGuiLogType_TTY:
      fflush((FILE *)pIVar3->LogFile);
      break;
    case ImGuiLogType_File:
      fclose((FILE *)pIVar3->LogFile);
      break;
    case ImGuiLogType_Clipboard:
      if ((1 < (pIVar3->LogBuffer).Buf.Size) &&
         (p_Var1 = (GImGui->IO).SetClipboardTextFn, p_Var1 != (_func_void_void_ptr_char_ptr *)0x0))
      {
        pcVar2 = (pIVar3->LogBuffer).Buf.Data;
        pcVar4 = ImGuiTextBuffer::EmptyString;
        if (pcVar2 != (char *)0x0) {
          pcVar4 = pcVar2;
        }
        (*p_Var1)((GImGui->IO).ClipboardUserData,pcVar4);
      }
    }
    pIVar3->LogEnabled = false;
    pIVar3->LogType = ImGuiLogType_None;
    pIVar3->LogFile = (ImFileHandle)0x0;
    ImGuiTextBuffer::clear(&pIVar3->LogBuffer);
    return;
  }
  return;
}

Assistant:

void ImGui::LogFinish()
{
    ImGuiContext& g = *GImGui;
    if (!g.LogEnabled)
        return;

    LogText(IM_NEWLINE);
    switch (g.LogType)
    {
    case ImGuiLogType_TTY:
#ifndef IMGUI_DISABLE_TTY_FUNCTIONS
        fflush(g.LogFile);
#endif
        break;
    case ImGuiLogType_File:
        ImFileClose(g.LogFile);
        break;
    case ImGuiLogType_Buffer:
        break;
    case ImGuiLogType_Clipboard:
        if (!g.LogBuffer.empty())
            SetClipboardText(g.LogBuffer.begin());
        break;
    case ImGuiLogType_None:
        IM_ASSERT(0);
        break;
    }

    g.LogEnabled = false;
    g.LogType = ImGuiLogType_None;
    g.LogFile = NULL;
    g.LogBuffer.clear();
}